

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::processBrokerDisconnect
          (CoreBroker *this,ActionMessage *command,BasicBrokerInfo *brk)

{
  long lVar1;
  bool bVar2;
  ConnectionState CVar3;
  BrokerState BVar4;
  __int_type_conflict _Var5;
  long in_RDX;
  action_t aVar6;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  ActionMessage dis_2;
  ActionMessage dis_1;
  ActionMessage dis;
  ActionMessage *in_stack_fffffffffffffa58;
  BrokerBase *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa70;
  undefined1 *puVar7;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffffa78;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffa80;
  GlobalFederateId local_514;
  BaseType local_510;
  GlobalFederateId local_50c;
  undefined1 local_508 [8];
  BaseType local_500;
  BaseType local_4f8;
  action_t in_stack_fffffffffffffb4c;
  CoreBroker *in_stack_fffffffffffffb50;
  BasicBrokerInfo *in_stack_fffffffffffffb98;
  CoreBroker *in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffbbb;
  InterfaceHandle in_stack_fffffffffffffbbc;
  BrokerBase *in_stack_fffffffffffffbc0;
  string_view in_stack_fffffffffffffbc8;
  GlobalFederateId in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffc70;
  GlobalFederateId in_stack_fffffffffffffc74;
  GlobalFederateId local_384;
  undefined1 local_380 [8];
  BaseType local_378;
  format_args in_stack_fffffffffffffcc0;
  string_view in_stack_fffffffffffffcd0;
  string_view in_stack_fffffffffffffd00;
  GlobalFederateId local_2b4;
  undefined1 local_2b0 [8];
  BaseType local_2a8;
  BaseType local_1f4;
  char *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [32];
  __sv_type local_1c0;
  __sv_type local_1b0;
  undefined4 local_19c;
  GlobalFederateId local_198 [50];
  ActionMessage *local_d0;
  BrokerBase *local_c8;
  __sv_type local_c0;
  undefined4 local_ac;
  GlobalFederateId local_a8;
  BaseType local_a4;
  long local_a0;
  ActionMessage *local_98;
  undefined1 local_88 [16];
  BaseType local_78 [4];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  BaseType *local_48;
  long local_40;
  char *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  BaseType local_1c;
  BaseType *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_a0 = in_RDX;
  local_98 = in_RSI;
  if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
    local_a4 = (in_RDI->super_BrokerBase).higher_broker_id.gid;
    bVar2 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalBrokerId)local_a4);
    if (bVar2) {
      _Var5 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffa68);
      aVar6 = (action_t)((ulong)in_stack_fffffffffffffa78 >> 0x20);
      if (8 < _Var5) {
        local_ac = 0;
        GlobalFederateId::GlobalFederateId(&local_a8,(GlobalBrokerId)0x0);
        getIdentifier_abi_cxx11_(in_RDI);
        local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa60);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        BrokerBase::sendToLogger
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbbc.hid
                   ,in_stack_fffffffffffffbc8,in_stack_fffffffffffffd00,
                   (bool)in_stack_fffffffffffffbbb);
        in_stack_fffffffffffffa58 = local_d0;
        in_stack_fffffffffffffa60 = local_c8;
      }
      sendDisconnect(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
      ActionMessage::ActionMessage((ActionMessage *)in_stack_fffffffffffffa80.this,aVar6);
      BrokerBase::addActionMessage(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa60);
      return;
    }
  }
  if (local_a0 != 0) {
    _Var5 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffa68);
    if (8 < _Var5) {
      local_19c = 0;
      GlobalFederateId::GlobalFederateId(local_198,(GlobalBrokerId)0x0);
      getIdentifier_abi_cxx11_(in_RDI);
      local_1b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa60);
      lVar1 = local_a0;
      local_1f0 = "got disconnect from {}({})";
      local_1e8 = 0x1a;
      local_1f4 = GlobalFederateId::baseValue(&local_98->source_id);
      local_28 = local_1e0;
      local_38 = local_1f0;
      uStack_30 = local_1e8;
      local_40 = lVar1;
      local_48 = &local_1f4;
      local_58 = local_1f0;
      uStack_50 = local_1e8;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_18 = local_78;
      local_1c = *local_48;
      local_8 = &local_68;
      local_68 = 0x1d;
      local_10 = local_88;
      local_78[0] = local_1c;
      local_60 = local_88;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc0);
      local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa60);
      in_stack_fffffffffffffa58 = (ActionMessage *)local_1c0._M_len;
      in_stack_fffffffffffffa60 = (BrokerBase *)local_1c0._M_str;
      BrokerBase::sendToLogger
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbbc.hid,
                 in_stack_fffffffffffffbc8,in_stack_fffffffffffffd00,(bool)in_stack_fffffffffffffbbb
                );
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
    }
    disconnectBroker(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  CVar3 = getAllConnectionState(in_stack_fffffffffffffa80.this);
  if (CVar3 < DISCONNECTED) {
    if ((local_a0 == 0) || ((*(byte *)(local_a0 + 0x2f) & 1) != 0)) {
      if ((((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) &&
         ((BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x54d6c7), BVar4 < OPERATING &&
          (local_a0 != 0)))) {
        aVar6 = cmd_disconnect_broker;
        if ((*(byte *)(local_a0 + 0x2e) & 1) != 0) {
          aVar6 = cmd_disconnect_core;
        }
        ActionMessage::setAction(local_98,aVar6);
        (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_98);
      }
    }
    else {
      if (((in_RDI->super_BrokerBase).globalDisconnect & 1U) == 0) {
        bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_98,error_flag);
        if (!bVar2) {
          puVar7 = local_508;
          ActionMessage::ActionMessage
                    ((ActionMessage *)in_stack_fffffffffffffa80.this,
                     (action_t)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          local_510 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_50c,(GlobalBrokerId)local_510);
          local_500 = local_50c.gid;
          GlobalFederateId::GlobalFederateId
                    (&local_514,(GlobalBrokerId)*(BaseType *)(local_a0 + 0x20));
          local_4f8 = local_514.gid;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])
                    (in_RDI,(ulong)*(uint *)(local_a0 + 0x24),puVar7);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa60);
        }
        *(undefined1 *)(local_a0 + 0x31) = 1;
      }
      if ((((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) &&
         (BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x54d619), BVar4 < OPERATING)) {
        aVar6 = cmd_disconnect_broker;
        if ((*(byte *)(local_a0 + 0x2e) & 1) != 0) {
          aVar6 = cmd_disconnect_core;
        }
        ActionMessage::setAction(local_98,aVar6);
        (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_98);
      }
      if (((in_RDI->super_BrokerBase).globalDisconnect & 1U) == 0) {
        (*(in_RDI->super_Broker)._vptr_Broker[0x25])(in_RDI,(ulong)*(uint *)(local_a0 + 0x24));
      }
    }
  }
  else {
    CLI::std::
    unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
    operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                *)0x54d1e5);
    BaseTimeCoordinator::disconnect
              ((BaseTimeCoordinator *)
               CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70));
    if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
      ActionMessage::ActionMessage
                ((ActionMessage *)in_stack_fffffffffffffa80.this,
                 (action_t)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      GlobalFederateId::GlobalFederateId
                (&local_2b4,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      local_2a8 = local_2b4.gid;
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_2b0);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa60);
    }
    else {
      if ((local_a0 != 0) && ((*(byte *)(local_a0 + 0x2f) & 1) == 0)) {
        if (((in_RDI->super_BrokerBase).globalDisconnect & 1U) == 0) {
          bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_98,error_flag);
          if (!bVar2) {
            ActionMessage::ActionMessage
                      ((ActionMessage *)in_stack_fffffffffffffa80.this,
                       (action_t)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            GlobalFederateId::GlobalFederateId
                      (&local_384,
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
            local_378 = local_384.gid;
            GlobalFederateId::GlobalFederateId
                      ((GlobalFederateId *)&stack0xfffffffffffffc74,
                       (GlobalBrokerId)*(BaseType *)(local_a0 + 0x20));
            (*(in_RDI->super_Broker)._vptr_Broker[0x22])
                      (in_RDI,(ulong)*(uint *)(local_a0 + 0x24),local_380);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa60);
          }
          *(undefined1 *)(local_a0 + 0x31) = 1;
          (*(in_RDI->super_Broker)._vptr_Broker[0x25])(in_RDI,(ulong)*(uint *)(local_a0 + 0x24));
        }
        else {
          gmlc::containers::
          DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
          ::
          apply<helics::CoreBroker::processBrokerDisconnect(helics::ActionMessage&,helics::BasicBrokerInfo*)::__0>
                    (in_stack_fffffffffffffa78,in_stack_fffffffffffffa80);
        }
      }
      ActionMessage::ActionMessage
                ((ActionMessage *)&stack0xfffffffffffffbb0,
                 (action_t)((ulong)&in_RDI->super_BrokerBase >> 0x20));
      BrokerBase::addActionMessage(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa60);
    }
  }
  return;
}

Assistant:

void CoreBroker::processBrokerDisconnect(ActionMessage& command, BasicBrokerInfo* brk)
{
    if (!isRootc) {
        if (command.source_id == higher_broker_id) {
            LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "got disconnect from parent");
            sendDisconnect(CMD_GLOBAL_DISCONNECT);
            addActionMessage(CMD_STOP);
            return;
        }
    }

    if (brk != nullptr) {
        LOG_CONNECTIONS(parent_broker_id,
                        getIdentifier(),
                        fmt::format("got disconnect from {}({})",
                                    brk->name,
                                    command.source_id.baseValue()));
        disconnectBroker(*brk);
    }

    if ((getAllConnectionState() >= ConnectionState::DISCONNECTED)) {
        timeCoord->disconnect();
        if (!isRootc) {
            ActionMessage dis(CMD_DISCONNECT);
            dis.source_id = global_broker_id_local;
            transmit(parent_route_id, dis);
        } else {
            if ((brk != nullptr) && (!brk->_nonLocal)) {
                if (globalDisconnect) {
                    mBrokers.apply([this](auto& broker) {
                        if (!broker._sent_disconnect_ack) {
                            ActionMessage dis((broker._core) ? CMD_DISCONNECT_CORE_ACK :
                                                               CMD_DISCONNECT_BROKER_ACK);
                            dis.source_id = global_broker_id_local;
                            dis.dest_id = broker.global_id;
                            this->transmit(broker.route, dis);
                            broker._sent_disconnect_ack = true;
                            this->removeRoute(broker.route);
                        }
                    });
                } else {
                    if (!checkActionFlag(command, error_flag)) {
                        ActionMessage dis((brk->_core) ? CMD_DISCONNECT_CORE_ACK :
                                                         CMD_DISCONNECT_BROKER_ACK);
                        dis.source_id = global_broker_id_local;
                        dis.dest_id = brk->global_id;
                        transmit(brk->route, dis);
                    }
                    brk->_sent_disconnect_ack = true;
                    removeRoute(brk->route);
                }
            }
            addActionMessage(CMD_STOP);
        }
    } else {
        if ((brk != nullptr) && (!brk->_nonLocal)) {
            if (!globalDisconnect) {
                if (!checkActionFlag(command, error_flag)) {
                    ActionMessage dis((brk->_core) ? CMD_DISCONNECT_CORE_ACK :
                                                     CMD_DISCONNECT_BROKER_ACK);
                    dis.source_id = global_broker_id_local;
                    dis.dest_id = brk->global_id;
                    transmit(brk->route, dis);
                }
                brk->_sent_disconnect_ack = true;
            }
            if ((!isRootc) && (getBrokerState() < BrokerState::OPERATING)) {
                command.setAction((brk->_core) ? CMD_DISCONNECT_CORE : CMD_DISCONNECT_BROKER);
                transmit(parent_route_id, command);
            }
            if (!globalDisconnect) {
                removeRoute(brk->route);
            }
        } else {
            if ((!isRootc) && (getBrokerState() < BrokerState::OPERATING)) {
                if (brk != nullptr) {
                    command.setAction((brk->_core) ? CMD_DISCONNECT_CORE : CMD_DISCONNECT_BROKER);
                    transmit(parent_route_id, command);
                }
            }
        }
    }
}